

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.h
# Opt level: O0

void blake2b224_test(void *key,int len,uint32_t seed,void *out)

{
  uint in_EDX;
  unsigned_long in_RDI;
  uchar *in_stack_00000030;
  hash_state *in_stack_00000038;
  unsigned_long in_stack_000000b0;
  uchar *in_stack_000000b8;
  unsigned_long in_stack_000000c0;
  hash_state *in_stack_000000c8;
  
  blake2b_init(in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
  ltc_state.chc.length = (ulong)in_EDX ^ 0x6a09e667f3bcc908;
  blake2b_process((hash_state *)CONCAT44(len,seed),(uchar *)out,in_RDI);
  blake2b_done(in_stack_00000038,in_stack_00000030);
  return;
}

Assistant:

inline void blake2b224_test(const void *key, int len, uint32_t seed, void *out)
{
  // objsize
  blake2b_init(&ltc_state, 28, NULL, 0);
  ltc_state.blake2b.h[0] = CONST64(0x6a09e667f3bcc908) ^ seed;
  blake2b_process(&ltc_state, (unsigned char *)key, len);
  blake2b_done(&ltc_state, (unsigned char *)out);
}